

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.h
# Opt level: O0

uint8_t * MPEGHeader::findNextMarker(uint8_t *buffer,uint8_t *end)

{
  uint8_t *end_local;
  uint8_t *buffer_local;
  
  end_local = buffer + 2;
  while( true ) {
    while( true ) {
      while( true ) {
        if (end <= end_local) {
          return end;
        }
        if (*end_local < 2) break;
        end_local = end_local + 3;
      }
      if (*end_local != '\0') break;
      end_local = end_local + 1;
    }
    if ((end_local[-2] == '\0') && (end_local[-1] == '\0')) break;
    end_local = end_local + 3;
  }
  return end_local + -2;
}

Assistant:

static uint8_t* findNextMarker(uint8_t* buffer, uint8_t* end)
    {
        // uint8_t* bufStart = buffer;
        for (buffer += 2; buffer < end;)
        {
            if (*buffer > 1)
                buffer += 3;
            else if (*buffer == 0)
                buffer++;
            else  // *buffer == 1
            {
                if (buffer[-2] == 0 && buffer[-1] == 0)
                    return buffer - 2;
                buffer += 3;
            }
        }
        return end;
    }